

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::generateLogon(Session *this,Message *aLogon)

{
  bool bVar1;
  FieldBase *field;
  SEQNUM SVar2;
  Header *header;
  FieldBase local_368;
  BOOLEAN local_309;
  FieldBase local_308;
  FieldBase local_2b0;
  FieldBase local_258;
  allocator<char> local_1e9;
  STRING local_1e8;
  MsgType local_1c8;
  undefined1 local_170 [8];
  Message logon;
  Message *aLogon_local;
  Session *this_local;
  
  logon._336_8_ = aLogon;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"A",&local_1e9);
  MsgType::MsgType(&local_1c8,&local_1e8);
  newMessage((Message *)local_170,this,&local_1c8);
  MsgType::~MsgType(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  EncryptMethod::EncryptMethod((EncryptMethod *)&local_258,0);
  FieldMap::setField((FieldMap *)local_170,&local_258,true);
  EncryptMethod::~EncryptMethod((EncryptMethod *)&local_258);
  bVar1 = SessionID::isFIXT(&this->m_sessionID);
  if (bVar1) {
    DefaultApplVerID::DefaultApplVerID
              ((DefaultApplVerID *)&local_2b0,&this->m_senderDefaultApplVerID);
    FieldMap::setField((FieldMap *)local_170,&local_2b0,true);
    DefaultApplVerID::~DefaultApplVerID((DefaultApplVerID *)&local_2b0);
  }
  bVar1 = SessionState::receivedReset(&this->m_state);
  if (bVar1) {
    local_309 = true;
    ResetSeqNumFlag::ResetSeqNumFlag((ResetSeqNumFlag *)&local_308,&local_309);
    FieldMap::setField((FieldMap *)local_170,&local_308,true);
    ResetSeqNumFlag::~ResetSeqNumFlag((ResetSeqNumFlag *)&local_308);
  }
  field = (FieldBase *)FieldMap::getField<FIX::HeartBtInt>((FieldMap *)logon._336_8_);
  FieldMap::setField((FieldMap *)local_170,field,true);
  if ((this->m_sendNextExpectedMsgSeqNum & 1U) != 0) {
    SVar2 = getExpectedTargetNum(this);
    NextExpectedMsgSeqNum::NextExpectedMsgSeqNum((NextExpectedMsgSeqNum *)&local_368,SVar2 + 1);
    FieldMap::setField((FieldMap *)local_170,&local_368,true);
    NextExpectedMsgSeqNum::~NextExpectedMsgSeqNum((NextExpectedMsgSeqNum *)&local_368);
  }
  header = Message::getHeader((Message *)local_170);
  fill(this,header);
  sendRaw(this,(Message *)local_170,0);
  SessionState::sentLogon(&this->m_state,true);
  Message::~Message((Message *)local_170);
  return;
}

Assistant:

void Session::generateLogon(const Message &aLogon) {
  Message logon = newMessage(MsgType(MsgType_Logon));

  logon.setField(EncryptMethod(0));
  if (m_sessionID.isFIXT()) {
    logon.setField(DefaultApplVerID(m_senderDefaultApplVerID));
  }
  if (m_state.receivedReset()) {
    logon.setField(ResetSeqNumFlag(true));
  }
  logon.setField(aLogon.getField<HeartBtInt>());
  if (m_sendNextExpectedMsgSeqNum) {
    logon.setField(NextExpectedMsgSeqNum(
        getExpectedTargetNum() + 1)); // +1 because incoming Logon did not increment the target SeqNum yet
  }
  fill(logon.getHeader());
  sendRaw(logon);
  m_state.sentLogon(true);
}